

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O3

void google::protobuf::compiler::php::anon_unknown_2::GenerateCEnum
               (EnumDescriptor *desc,Printer *printer)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3;
  uint __val;
  uint uVar3;
  uint uVar4;
  uint __len;
  ulong uVar5;
  long lVar6;
  string __str;
  string php_name;
  string local_98;
  string c_name;
  string local_50;
  
  c_name._M_dataplus._M_p = (pointer)&c_name.field_2;
  lVar6 = *(long *)(*(long *)(desc + 8) + 0x20);
  std::__cxx11::string::_M_construct<char*>
            ((string *)&c_name,lVar6,*(long *)(*(long *)(desc + 8) + 0x28) + lVar6);
  php_name._M_dataplus._M_p = (pointer)&php_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&php_name,".","");
  paVar1 = &local_98.field_2;
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"_","");
  StringReplace(&__str,&c_name,&php_name,&local_98,true);
  std::__cxx11::string::operator=((string *)&c_name,(string *)&__str);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str._M_dataplus._M_p != &__str.field_2) {
    operator_delete(__str._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)php_name._M_dataplus._M_p != &php_name.field_2) {
    operator_delete(php_name._M_dataplus._M_p);
  }
  __str.field_2._M_allocated_capacity = 0;
  __str.field_2._8_8_ = 0;
  __str._M_dataplus._M_p = (pointer)0x0;
  __str._M_string_length = 0;
  FullClassName<google::protobuf::EnumDescriptor>(&php_name,desc,(Options *)&__str);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__str._M_string_length);
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"\\","");
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"\\\\","");
  StringReplace(&__str,&php_name,&local_98,&local_50,true);
  std::__cxx11::string::operator=((string *)&php_name,(string *)&__str);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str._M_dataplus._M_p != &__str.field_2) {
    operator_delete(__str._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  lVar6 = *(long *)(desc + 8);
  (anonymous_namespace)::FilenameCName_abi_cxx11_
            (&__str,*(_anonymous_namespace_ **)**(long **)(desc + 0x10),
             (FileDescriptor *)((undefined8 *)**(long **)(desc + 0x10))[1]);
  io::Printer::
  Print<char[5],std::__cxx11::string,char[12],std::__cxx11::string,char[7],std::__cxx11::string,char[9],std::__cxx11::string>
            (printer,
             "/* $c_name$ */\n\nzend_class_entry* $c_name$_ce;\n\nPHP_METHOD($c_name$, name) {\n  $file_c_name$_AddDescriptor();\n  const upb_symtab *symtab = DescriptorPool_GetSymbolTable();\n  const upb_enumdef *e = upb_symtab_lookupenum(symtab, \"$name$\");\n  const char *name;\n  zend_long value;\n  if (zend_parse_parameters(ZEND_NUM_ARGS(), \"l\", &value) ==\n      FAILURE) {\n    return;\n  }\n  name = upb_enumdef_iton(e, value);\n  if (!name) {\n    zend_throw_exception_ex(NULL, 0,\n                            \"$php_name$ has no name \"\n                            \"defined for value \" ZEND_LONG_FMT \".\",\n                            value);\n    return;\n  }\n  RETURN_STRING(name);\n}\n\nPHP_METHOD($c_name$, value) {\n  $file_c_name$_AddDescriptor();\n  const upb_symtab *symtab = DescriptorPool_GetSymbolTable();\n  const upb_enumdef *e = upb_symtab_lookupenum(symtab, \"$name$\");\n  char *name = NULL;\n  size_t name_len;\n  int32_t num;\n  if (zend_parse_parameters(ZEND_NUM_ARGS(), \"s\", &name,\n                            &name_len) == FAILURE) {\n    return;\n  }\n  if (!upb_enumdef_ntoi(e, name, name_len, &num)) {\n    zend_throw_exception_ex(NULL, 0,\n                            \"$php_name$ has no value \"\n                            \"defined for name %s.\",\n                            name);\n    return;\n  }\n  RETURN_LONG(num);\n}\n\nstatic zend_function_entry $c_name$_phpmethods[] = {\n  PHP_ME($c_name$, name, arginfo_lookup, ZEND_ACC_PUBLIC | ZEND_ACC_STATIC)\n  PHP_ME($c_name$, value, arginfo_lookup, ZEND_ACC_PUBLIC | ZEND_ACC_STATIC)\n  ZEND_FE_END\n};\n\nstatic void $c_name$_ModuleInit() {\n  zend_class_entry tmp_ce;\n\n  INIT_CLASS_ENTRY(tmp_ce, \"$php_name$\",\n                   $c_name$_phpmethods);\n\n  $c_name$_ce = zend_register_internal_class(&tmp_ce);\n"
             ,(char (*) [5])0x3ea8a1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(lVar6 + 0x20),
             (char (*) [12])"file_c_name",&__str,(char (*) [7])0x3e9007,&c_name,
             (char (*) [9])"php_name",&php_name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str._M_dataplus._M_p != &__str.field_2) {
    operator_delete(__str._M_dataplus._M_p);
  }
  if (0 < *(int *)(desc + 4)) {
    lVar6 = 0;
    do {
      uVar2 = *(uint *)(*(long *)(desc + 0x28) + 4 + lVar6 * 0x20);
      __val = -uVar2;
      if (0 < (int)uVar2) {
        __val = uVar2;
      }
      __len = 1;
      if (9 < __val) {
        uVar5 = (ulong)__val;
        uVar3 = 4;
        do {
          __len = uVar3;
          uVar4 = (uint)uVar5;
          if (uVar4 < 100) {
            __len = __len - 2;
            goto LAB_0027e6de;
          }
          if (uVar4 < 1000) {
            __len = __len - 1;
            goto LAB_0027e6de;
          }
          if (uVar4 < 10000) goto LAB_0027e6de;
          uVar5 = uVar5 / 10000;
          uVar3 = __len + 4;
        } while (99999 < uVar4);
        __len = __len + 1;
      }
LAB_0027e6de:
      args_3 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                (*(long *)(desc + 0x28) + 8 + lVar6 * 0x20);
      __str._M_dataplus._M_p = (pointer)&__str.field_2;
      std::__cxx11::string::_M_construct((ulong)&__str,(char)__len - (char)((int)uVar2 >> 0x1f));
      std::__detail::__to_chars_10_impl<unsigned_int>
                (__str._M_dataplus._M_p + (uVar2 >> 0x1f),__len,__val);
      io::Printer::
      Print<char[7],std::__cxx11::string,char[5],std::__cxx11::string,char[4],std::__cxx11::string>
                (printer,
                 "  zend_declare_class_constant_long($c_name$_ce, \"$name$\",\n                                   strlen(\"$name$\"), $num$);\n"
                 ,(char (*) [7])0x3e9007,&c_name,(char (*) [5])0x3ea8a1,args_3,
                 (char (*) [4])0x3e5468,&__str);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p != &__str.field_2) {
        operator_delete(__str._M_dataplus._M_p);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < *(int *)(desc + 4));
  }
  io::Printer::Print<>(printer,"}\n\n");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)php_name._M_dataplus._M_p != &php_name.field_2) {
    operator_delete(php_name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)c_name._M_dataplus._M_p != &c_name.field_2) {
    operator_delete(c_name._M_dataplus._M_p);
  }
  return;
}

Assistant:

void GenerateCEnum(const EnumDescriptor* desc, io::Printer* printer) {
  std::string c_name = desc->full_name();
  c_name = StringReplace(c_name, ".", "_", true);
  std::string php_name = FullClassName(desc, Options());
  php_name = StringReplace(php_name, "\\", "\\\\", true);
  printer->Print(
      "/* $c_name$ */\n"
      "\n"
      "zend_class_entry* $c_name$_ce;\n"
      "\n"
      "PHP_METHOD($c_name$, name) {\n"
      "  $file_c_name$_AddDescriptor();\n"
      "  const upb_symtab *symtab = DescriptorPool_GetSymbolTable();\n"
      "  const upb_enumdef *e = upb_symtab_lookupenum(symtab, \"$name$\");\n"
      "  const char *name;\n"
      "  zend_long value;\n"
      "  if (zend_parse_parameters(ZEND_NUM_ARGS(), \"l\", &value) ==\n"
      "      FAILURE) {\n"
      "    return;\n"
      "  }\n"
      "  name = upb_enumdef_iton(e, value);\n"
      "  if (!name) {\n"
      "    zend_throw_exception_ex(NULL, 0,\n"
      "                            \"$php_name$ has no name \"\n"
      "                            \"defined for value \" ZEND_LONG_FMT \".\",\n"
      "                            value);\n"
      "    return;\n"
      "  }\n"
      "  RETURN_STRING(name);\n"
      "}\n"
      "\n"
      "PHP_METHOD($c_name$, value) {\n"
      "  $file_c_name$_AddDescriptor();\n"
      "  const upb_symtab *symtab = DescriptorPool_GetSymbolTable();\n"
      "  const upb_enumdef *e = upb_symtab_lookupenum(symtab, \"$name$\");\n"
      "  char *name = NULL;\n"
      "  size_t name_len;\n"
      "  int32_t num;\n"
      "  if (zend_parse_parameters(ZEND_NUM_ARGS(), \"s\", &name,\n"
      "                            &name_len) == FAILURE) {\n"
      "    return;\n"
      "  }\n"
      "  if (!upb_enumdef_ntoi(e, name, name_len, &num)) {\n"
      "    zend_throw_exception_ex(NULL, 0,\n"
      "                            \"$php_name$ has no value \"\n"
      "                            \"defined for name %s.\",\n"
      "                            name);\n"
      "    return;\n"
      "  }\n"
      "  RETURN_LONG(num);\n"
      "}\n"
      "\n"
      "static zend_function_entry $c_name$_phpmethods[] = {\n"
      "  PHP_ME($c_name$, name, arginfo_lookup, ZEND_ACC_PUBLIC | ZEND_ACC_STATIC)\n"
      "  PHP_ME($c_name$, value, arginfo_lookup, ZEND_ACC_PUBLIC | ZEND_ACC_STATIC)\n"
      "  ZEND_FE_END\n"
      "};\n"
      "\n"
      "static void $c_name$_ModuleInit() {\n"
      "  zend_class_entry tmp_ce;\n"
      "\n"
      "  INIT_CLASS_ENTRY(tmp_ce, \"$php_name$\",\n"
      "                   $c_name$_phpmethods);\n"
      "\n"
      "  $c_name$_ce = zend_register_internal_class(&tmp_ce);\n",
      "name", desc->full_name(),
      "file_c_name", FilenameCName(desc->file()),
      "c_name", c_name,
      "php_name", php_name);

  for (int i = 0; i < desc->value_count(); i++) {
    const EnumValueDescriptor* value = desc->value(i);
    printer->Print(
        "  zend_declare_class_constant_long($c_name$_ce, \"$name$\",\n"
        "                                   strlen(\"$name$\"), $num$);\n",
        "c_name", c_name,
        "name", value->name(),
        "num", std::to_string(value->number()));
  }

  printer->Print(
      "}\n"
      "\n");
}